

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void CTPNPreInc_gen_code(CTcPrsNode *sub,int discard)

{
  int iVar1;
  undefined4 in_ESI;
  long *in_RDI;
  void *ctx;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  undefined1 local_18 [12];
  undefined4 local_c;
  long *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  iVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,in_ESI,1,0xc,"++",0,0,1,local_18);
  if (iVar1 == 0) {
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    (**(code **)(*local_8 + 0x90))(local_8,local_c,2,0xc,"++",0,0,1,local_18);
  }
  return;
}

Assistant:

void CTPNPreInc_gen_code(CTcPrsNode *sub, int discard)
{
    /* ask the subnode to generate it */
    void *ctx;
    if (!sub->gen_code_asi(discard, 1, TC_ASI_PREINC, "++",
                           0, FALSE, TRUE, &ctx))
    {
        /* increment the value at top of stack */
        G_cg->write_op(OPC_INC);

        /* 
         *   generate a simple assignment back to the subexpression; if
         *   we're using the value, let the simple assignment leave its
         *   value on the stack, since the result is the value *after* the
         *   increment 
         */
        sub->gen_code_asi(discard, 2, TC_ASI_PREINC, "++",
                          0, FALSE, TRUE, &ctx);
    }
}